

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

void rshift(Bigint *b,int k)

{
  sbyte sVar1;
  int iVar2;
  ULong *pUVar3;
  uint local_34;
  int n;
  ULong y;
  ULong *xe;
  ULong *x1;
  ULong *x;
  int k_local;
  Bigint *b_local;
  
  xe = b->x;
  if (k >> 5 < b->wds) {
    pUVar3 = xe + b->wds;
    x1 = xe + (k >> 5);
    if ((k & 0x1fU) == 0) {
      while (x1 < pUVar3) {
        *xe = *x1;
        xe = xe + 1;
        x1 = x1 + 1;
      }
    }
    else {
      sVar1 = (sbyte)(k & 0x1fU);
      local_34 = *x1;
      while( true ) {
        x1 = x1 + 1;
        local_34 = local_34 >> sVar1;
        if (pUVar3 <= x1) break;
        *xe = local_34 | *x1 << (0x20U - sVar1 & 0x1f);
        local_34 = *x1;
        xe = xe + 1;
      }
      *xe = local_34;
      if (local_34 != 0) {
        xe = xe + 1;
      }
    }
  }
  iVar2 = (int)((long)xe - (long)b->x >> 2);
  b->wds = iVar2;
  if (iVar2 == 0) {
    b->x[0] = 0;
  }
  return;
}

Assistant:

static void
rshift(Bigint *b, int k)
{
	ULong *x, *x1, *xe, y;
	int n;

	x = x1 = b->x;
	n = k >> kshift;
	if (n < b->wds) {
		xe = x + b->wds;
		x += n;
		if (k &= kmask) {
			n = 32 - k;
			y = *x++ >> k;
			while(x < xe) {
				*x1++ = (y | (*x << n)) & 0xffffffff;
				y = *x++ >> k;
				}
			if ((*x1 = y) !=0)
				x1++;
			}
		else
			while(x < xe)
				*x1++ = *x++;
		}
	if ((b->wds = x1 - b->x) == 0)
		b->x[0] = 0;
	}